

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_basic_value_constructor_list_Test::~ObjectTest_basic_value_constructor_list_Test
          (ObjectTest_basic_value_constructor_list_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_value_constructor_list) {
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<bool>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<signed char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<unsigned char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<short>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<int>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<long long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<intmax_t>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<float>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<long double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<std::u8string>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::list<object>);
}